

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O2

void table_select(ge_precomp *t,int pos,char b)

{
  byte bVar1;
  int iVar2;
  undefined7 in_register_00000011;
  uint8_t (*paauVar3) [3] [32];
  uintptr_t a_u;
  ulong uVar4;
  uint8_t (*paauVar5) [3] [32];
  size_t i;
  long lVar6;
  uint8_t t_bytes [3] [32];
  fe xy2d;
  fe yminusx;
  fe yplusx;
  ge_precomp minust;
  ulong local_188;
  uint8_t auStack_180 [24];
  ulong local_168;
  uint8_t auStack_160 [64];
  fe local_120;
  fe local_f8;
  fe local_d0;
  ge_precomp local_a8;
  
  iVar2 = (int)CONCAT71(in_register_00000011,b);
  auStack_180[0] = '\0';
  auStack_180[1] = '\0';
  auStack_180[2] = '\0';
  auStack_180[3] = '\0';
  auStack_180[4] = '\0';
  auStack_180[5] = '\0';
  auStack_180[6] = '\0';
  auStack_180[7] = '\0';
  auStack_160[0] = '\0';
  auStack_160[1] = '\0';
  auStack_160[2] = '\0';
  auStack_160[3] = '\0';
  auStack_160[4] = '\0';
  auStack_160[5] = '\0';
  auStack_160[6] = '\0';
  auStack_160[7] = '\0';
  auStack_160[0x28] = '\0';
  auStack_160[0x29] = '\0';
  auStack_160[0x2a] = '\0';
  auStack_160[0x2b] = '\0';
  auStack_160[0x2c] = '\0';
  auStack_160[0x2d] = '\0';
  auStack_160[0x2e] = '\0';
  auStack_160[0x2f] = '\0';
  auStack_160[0x30] = '\0';
  auStack_160[0x31] = '\0';
  auStack_160[0x32] = '\0';
  auStack_160[0x33] = '\0';
  auStack_160[0x34] = '\0';
  auStack_160[0x35] = '\0';
  auStack_160[0x36] = '\0';
  auStack_160[0x37] = '\0';
  auStack_160[0x18] = '\0';
  auStack_160[0x19] = '\0';
  auStack_160[0x1a] = '\0';
  auStack_160[0x1b] = '\0';
  auStack_160[0x1c] = '\0';
  auStack_160[0x1d] = '\0';
  auStack_160[0x1e] = '\0';
  auStack_160[0x1f] = '\0';
  auStack_160[0x20] = '\0';
  auStack_160[0x21] = '\0';
  auStack_160[0x22] = '\0';
  auStack_160[0x23] = '\0';
  auStack_160[0x24] = '\0';
  auStack_160[0x25] = '\0';
  auStack_160[0x26] = '\0';
  auStack_160[0x27] = '\0';
  auStack_160[8] = '\0';
  auStack_160[9] = '\0';
  auStack_160[10] = '\0';
  auStack_160[0xb] = '\0';
  auStack_160[0xc] = '\0';
  auStack_160[0xd] = '\0';
  auStack_160[0xe] = '\0';
  auStack_160[0xf] = '\0';
  auStack_160[0x10] = '\0';
  auStack_160[0x11] = '\0';
  auStack_160[0x12] = '\0';
  auStack_160[0x13] = '\0';
  auStack_160[0x14] = '\0';
  auStack_160[0x15] = '\0';
  auStack_160[0x16] = '\0';
  auStack_160[0x17] = '\0';
  auStack_180[8] = '\0';
  auStack_180[9] = '\0';
  auStack_180[10] = '\0';
  auStack_180[0xb] = '\0';
  auStack_180[0xc] = '\0';
  auStack_180[0xd] = '\0';
  auStack_180[0xe] = '\0';
  auStack_180[0xf] = '\0';
  auStack_180[0x10] = '\0';
  auStack_180[0x11] = '\0';
  auStack_180[0x12] = '\0';
  auStack_180[0x13] = '\0';
  auStack_180[0x14] = '\0';
  auStack_180[0x15] = '\0';
  auStack_180[0x16] = '\0';
  auStack_180[0x17] = '\0';
  bVar1 = (byte)((byte)((ulong)((long)iVar2 + -1) >> 0x38) & ~(byte)(iVar2 >> 0x1f)) >> 7;
  local_188 = (ulong)bVar1;
  local_168 = (ulong)bVar1;
  paauVar3 = k25519Precomp[pos];
  uVar4 = 0;
  paauVar5 = paauVar3;
  while( true ) {
    if (uVar4 == 8) {
      fe_frombytes_strict(&local_d0,(uint8_t *)&local_188);
      fe_frombytes_strict(&local_f8,(uint8_t *)&local_168);
      fe_frombytes_strict(&local_120,auStack_160 + 0x18);
      (t->yplusx).v[4] = local_d0.v[4];
      (t->yplusx).v[2] = local_d0.v[2];
      (t->yplusx).v[3] = local_d0.v[3];
      (t->yplusx).v[0] = local_d0.v[0];
      (t->yplusx).v[1] = local_d0.v[1];
      (t->yminusx).v[4] = local_f8.v[4];
      (t->yminusx).v[2] = local_f8.v[2];
      (t->yminusx).v[3] = local_f8.v[3];
      (t->yminusx).v[0] = local_f8.v[0];
      (t->yminusx).v[1] = local_f8.v[1];
      (t->xy2d).v[4] = local_120.v[4];
      (t->xy2d).v[2] = local_120.v[2];
      (t->xy2d).v[3] = local_120.v[3];
      (t->xy2d).v[0] = local_120.v[0];
      (t->xy2d).v[1] = local_120.v[1];
      local_a8.yplusx.v[4] = local_f8.v[4];
      local_a8.yplusx.v[2] = local_f8.v[2];
      local_a8.yplusx.v[3] = local_f8.v[3];
      local_a8.yplusx.v[0] = local_f8.v[0];
      local_a8.yplusx.v[1] = local_f8.v[1];
      local_a8.yminusx.v[0] = local_d0.v[0];
      local_a8.yminusx.v[1] = local_d0.v[1];
      local_a8.yminusx.v[2] = local_d0.v[2];
      local_a8.yminusx.v[3] = local_d0.v[3];
      local_a8.yminusx.v[4] = local_d0.v[4];
      fe_neg(&local_a8.xy2d,&local_120);
      cmov(t,&local_a8,(byte)((ulong)((long)iVar2 >> 0x3f) >> 7) & 1);
      return;
    }
    if (paauVar3 + uVar4 < (uint8_t (*) [3] [32])(auStack_160 + 0x38) &&
        (uint8_t (*) [3] [32])&local_188 < paauVar3 + uVar4 + 1) break;
    uVar4 = uVar4 + 1;
    for (lVar6 = 0; lVar6 != 0x60; lVar6 = lVar6 + 1) {
      *(byte *)((long)&local_188 + lVar6) =
           *(byte *)((long)&local_188 + lVar6) ^
           (*(uint8_t (*) [3] [32])*paauVar5)[0][lVar6] &
           (byte)((long)((uVar4 & 0xffffffff ^
                         (ulong)(byte)(b + ((byte)(iVar2 >> 7) & 0xff & b) * -2)) - 1) >> 0x3f);
    }
    paauVar5 = paauVar5 + 1;
  }
  __assert_fail("!buffers_alias(dst, n, src, n)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/curve25519/../internal.h"
                ,0x1ab,
                "void constant_time_conditional_memxor(void *, const void *, size_t, const crypto_word_t)"
               );
}

Assistant:

static void table_select(ge_precomp *t, const int pos, const signed char b) {
  uint8_t bnegative = constant_time_msb_w(b);
  uint8_t babs = b - ((bnegative & b) << 1);

  uint8_t t_bytes[3][32] = {
      {static_cast<uint8_t>(constant_time_is_zero_w(b) & 1)},
      {static_cast<uint8_t>(constant_time_is_zero_w(b) & 1)},
      {0}};
#if defined(__clang__)  // materialize for vectorization, 6% speedup
  __asm__("" : "+m"(t_bytes) : /*no inputs*/);
#endif
  static_assert(sizeof(t_bytes) == sizeof(k25519Precomp[pos][0]), "");
  for (int i = 0; i < 8; i++) {
    constant_time_conditional_memxor(t_bytes, k25519Precomp[pos][i],
                                     sizeof(t_bytes),
                                     constant_time_eq_w(babs, 1 + i));
  }

  fe yplusx, yminusx, xy2d;
  fe_frombytes_strict(&yplusx, t_bytes[0]);
  fe_frombytes_strict(&yminusx, t_bytes[1]);
  fe_frombytes_strict(&xy2d, t_bytes[2]);

  fe_copy_lt(&t->yplusx, &yplusx);
  fe_copy_lt(&t->yminusx, &yminusx);
  fe_copy_lt(&t->xy2d, &xy2d);

  ge_precomp minust;
  fe_copy_lt(&minust.yplusx, &yminusx);
  fe_copy_lt(&minust.yminusx, &yplusx);
  fe_neg(&minust.xy2d, &xy2d);
  cmov(t, &minust, bnegative >> 7);
}